

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURLMcode curl_multi_waitfds(Curl_multi *multi,curl_waitfd *ufds,uint size,uint *fd_count)

{
  CURLcode CVar1;
  Curl_llist_node *n;
  Curl_easy *data;
  CURLMcode CVar2;
  curl_waitfds cwfds;
  
  if (ufds == (curl_waitfd *)0x0) {
    CVar2 = CURLM_BAD_FUNCTION_ARGUMENT;
  }
  else {
    CVar2 = CURLM_BAD_HANDLE;
    if ((multi != (Curl_multi *)0x0) && (multi->magic == 0xbab1e)) {
      if ((multi->field_0x279 & 4) == 0) {
        Curl_waitfds_init(&cwfds,ufds,size);
        n = Curl_llist_head(&multi->process);
        CVar2 = CURLM_OUT_OF_MEMORY;
        for (; n != (Curl_llist_node *)0x0; n = Curl_node_next(n)) {
          data = (Curl_easy *)Curl_node_elem(n);
          multi_getsock(data,&data->last_poll);
          CVar1 = Curl_waitfds_add_ps(&cwfds,&data->last_poll);
          if (CVar1 != CURLE_OK) goto LAB_00140ada;
        }
        CVar1 = Curl_cpool_add_waitfds(&multi->cpool,&cwfds);
        CVar2 = (uint)(CVar1 != CURLE_OK) * 3;
LAB_00140ada:
        if (fd_count != (uint *)0x0) {
          *fd_count = cwfds.n;
        }
      }
      else {
        CVar2 = CURLM_RECURSIVE_API_CALL;
      }
    }
  }
  return CVar2;
}

Assistant:

CURLMcode curl_multi_waitfds(struct Curl_multi *multi,
                             struct curl_waitfd *ufds,
                             unsigned int size,
                             unsigned int *fd_count)
{
  struct curl_waitfds cwfds;
  CURLMcode result = CURLM_OK;
  struct Curl_llist_node *e;

  if(!ufds)
    return CURLM_BAD_FUNCTION_ARGUMENT;

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  Curl_waitfds_init(&cwfds, ufds, size);
  for(e = Curl_llist_head(&multi->process); e; e = Curl_node_next(e)) {
    struct Curl_easy *data = Curl_node_elem(e);
    multi_getsock(data, &data->last_poll);
    if(Curl_waitfds_add_ps(&cwfds, &data->last_poll)) {
      result = CURLM_OUT_OF_MEMORY;
      goto out;
    }
  }

  if(Curl_cpool_add_waitfds(&multi->cpool, &cwfds)) {
    result = CURLM_OUT_OF_MEMORY;
    goto out;
  }

out:
  if(fd_count)
    *fd_count = cwfds.n;
  return result;
}